

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O2

void __thiscall
cmsys::
hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
::_M_initialize_buckets
          (hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
           *this,size_type __n)

{
  size_t __n_00;
  size_t in_stack_ffffffffffffffd8;
  value_type local_20;
  
  __n_00 = _stl_next_prime(in_stack_ffffffffffffffd8);
  std::vector<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>::
  reserve(&this->_M_buckets,__n_00);
  local_20 = (value_type)0x0;
  std::vector<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>::insert
            (&this->_M_buckets,
             (const_iterator)
             (this->_M_buckets).
             super__Vector_base<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish,__n_00,&local_20);
  this->_M_num_elements = 0;
  return;
}

Assistant:

void _M_initialize_buckets(size_type __n)
  {
    const size_type __n_buckets = _M_next_size(__n);
    _M_buckets.reserve(__n_buckets);
    _M_buckets.insert(_M_buckets.end(), __n_buckets, (_Node*) 0);
    _M_num_elements = 0;
  }